

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_opt.c
# Opt level: O2

U32 ZSTD_insertAndFindFirstIndexHash3(ZSTD_matchState_t *ms,BYTE *ip)

{
  uint uVar1;
  int iVar2;
  U32 *pUVar3;
  BYTE *pBVar4;
  byte bVar5;
  ulong uVar6;
  uint uVar7;
  
  pUVar3 = ms->hashTable3;
  pBVar4 = (ms->window).base;
  uVar1 = ms->nextToUpdate3;
  uVar7 = (int)ip - (int)pBVar4;
  ms->nextToUpdate3 = uVar7;
  iVar2 = *(int *)ip;
  bVar5 = 0x20 - (char)ms->hashLog3;
  for (uVar6 = (ulong)uVar1; uVar6 < uVar7; uVar6 = uVar6 + 1) {
    pUVar3[(uint)(*(int *)(pBVar4 + uVar6) * 0x35a7bd00) >> (bVar5 & 0x1f)] = (U32)uVar6;
  }
  return pUVar3[(uint)(iVar2 * 0x35a7bd00) >> (bVar5 & 0x1f)];
}

Assistant:

static U32 ZSTD_insertAndFindFirstIndexHash3 (ZSTD_matchState_t* ms, const BYTE* const ip)
{
    U32* const hashTable3 = ms->hashTable3;
    U32 const hashLog3 = ms->hashLog3;
    const BYTE* const base = ms->window.base;
    U32 idx = ms->nextToUpdate3;
    U32 const target = ms->nextToUpdate3 = (U32)(ip - base);
    size_t const hash3 = ZSTD_hash3Ptr(ip, hashLog3);
    assert(hashLog3 > 0);

    while(idx < target) {
        hashTable3[ZSTD_hash3Ptr(base+idx, hashLog3)] = idx;
        idx++;
    }

    return hashTable3[hash3];
}